

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::labelAsDisconnected(CoreBroker *this,GlobalBrokerId brkid)

{
  pointer pBVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  
  pBVar1 = (this->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pBVar3 = (this->mBrokers).dataStorage.
                super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; pBVar3 != pBVar1; pBVar3 = pBVar3 + 1) {
    if ((pBVar3->parent).gid == brkid.gid) {
      pBVar3->state = DISCONNECTED;
    }
  }
  pBVar2 = (this->mFederates).dataStorage.
           super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pBVar4 = (this->mFederates).dataStorage.
                super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pBVar4 != pBVar2; pBVar4 = pBVar4 + 1) {
    if ((pBVar4->parent).gid == brkid.gid) {
      pBVar4->state = DISCONNECTED;
    }
  }
  return;
}

Assistant:

void CoreBroker::labelAsDisconnected(GlobalBrokerId brkid)
{
    auto disconnect_procedure = [brkid](auto& obj) {
        if (obj.parent == brkid) {
            obj.state = ConnectionState::DISCONNECTED;
        }
    };
    mBrokers.apply(disconnect_procedure);
    mFederates.apply(disconnect_procedure);
}